

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

bool cmFileAPI::ReadRequestVersions
               (Value *version,
               vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
               *versions,string *error)

{
  bool bVar1;
  reference version_00;
  const_iterator cVar2;
  Value *v;
  undefined1 local_60 [8];
  const_iterator __end2;
  undefined1 local_40 [8];
  const_iterator __begin2;
  Value *__range2;
  string *error_local;
  vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *versions_local;
  Value *version_local;
  
  bVar1 = Json::Value::isArray(version);
  if (bVar1) {
    __begin2.super_ValueIteratorBase._8_8_ = version;
    cVar2 = Json::Value::begin(version);
    __end2.super_ValueIteratorBase._8_8_ = cVar2.super_ValueIteratorBase.current_._M_node;
    __begin2.super_ValueIteratorBase.current_._M_node._0_1_ = cVar2.super_ValueIteratorBase.isNull_;
    local_40 = (undefined1  [8])__end2.super_ValueIteratorBase._8_8_;
    cVar2 = Json::Value::end((Value *)__begin2.super_ValueIteratorBase._8_8_);
    local_60 = (undefined1  [8])cVar2.super_ValueIteratorBase.current_._M_node;
    __end2.super_ValueIteratorBase.current_._M_node._0_1_ = cVar2.super_ValueIteratorBase.isNull_;
    while (bVar1 = Json::ValueIteratorBase::operator!=
                             ((ValueIteratorBase *)local_40,(SelfType *)local_60), bVar1) {
      version_00 = Json::ValueConstIterator::operator*((ValueConstIterator *)local_40);
      bVar1 = ReadRequestVersion(version_00,true,versions,error);
      if (!bVar1) {
        return false;
      }
      Json::ValueConstIterator::operator++((ValueConstIterator *)local_40);
    }
  }
  else {
    bVar1 = ReadRequestVersion(version,false,versions,error);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool cmFileAPI::ReadRequestVersions(Json::Value const& version,
                                    std::vector<RequestVersion>& versions,
                                    std::string& error)
{
  if (version.isArray()) {
    for (Json::Value const& v : version) {
      if (!ReadRequestVersion(v, /*inArray=*/true, versions, error)) {
        return false;
      }
    }
  } else {
    if (!ReadRequestVersion(version, /*inArray=*/false, versions, error)) {
      return false;
    }
  }
  return true;
}